

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluationFile.cxx
# Opt level: O0

void __thiscall
cmGeneratorExpressionEvaluationFile::cmGeneratorExpressionEvaluationFile
          (cmGeneratorExpressionEvaluationFile *this,string *input,
          auto_ptr<cmCompiledGeneratorExpression> *outputFileExpr,
          auto_ptr<cmCompiledGeneratorExpression> *condition,bool inputIsContent,
          PolicyStatus policyStatusCMP0070)

{
  PolicyStatus policyStatusCMP0070_local;
  bool inputIsContent_local;
  auto_ptr<cmCompiledGeneratorExpression> *condition_local;
  auto_ptr<cmCompiledGeneratorExpression> *outputFileExpr_local;
  string *input_local;
  cmGeneratorExpressionEvaluationFile *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)input);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr(&this->OutputFileExpr,outputFileExpr);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr(&this->Condition,condition);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Files);
  this->InputIsContent = inputIsContent;
  this->PolicyStatusCMP0070 = policyStatusCMP0070;
  return;
}

Assistant:

cmGeneratorExpressionEvaluationFile::cmGeneratorExpressionEvaluationFile(
  const std::string& input,
  CM_AUTO_PTR<cmCompiledGeneratorExpression> outputFileExpr,
  CM_AUTO_PTR<cmCompiledGeneratorExpression> condition, bool inputIsContent,
  cmPolicies::PolicyStatus policyStatusCMP0070)
  : Input(input)
  , OutputFileExpr(outputFileExpr)
  , Condition(condition)
  , InputIsContent(inputIsContent)
  , PolicyStatusCMP0070(policyStatusCMP0070)
{
}